

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CustomLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_custom(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 500) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 500;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.custom_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CustomLayerParams>
                   (arena);
    (this->layer_).custom_ = (CustomLayerParams *)LVar2;
  }
  return (CustomLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::CustomLayerParams* NeuralNetworkLayer::_internal_mutable_custom() {
  if (!_internal_has_custom()) {
    clear_layer();
    set_has_custom();
    layer_.custom_ = CreateMaybeMessage< ::CoreML::Specification::CustomLayerParams >(GetArenaForAllocation());
  }
  return layer_.custom_;
}